

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  long lVar5;
  istream local_270 [8];
  fstream fs;
  int local_60;
  int arg;
  undefined1 local_50 [8];
  VersionsList versions;
  bool verbose;
  char *progname;
  int flags;
  int ch;
  char **argv_local;
  int argc_local;
  
  progname._0_4_ = 0;
  pcVar1 = *argv;
  versions.versions_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  while (iVar3 = getopt(argc,argv,"pahvV"), iVar2 = _optind, iVar3 != -1) {
    switch(iVar3) {
    case 0x3f:
    case 0x68:
      print_usage(pcVar1);
      return 0;
    default:
      print_usage(pcVar1);
      return 1;
    case 0x56:
      print_version();
      return 0;
    case 0x61:
      progname._0_4_ = (uint)progname | 2;
      break;
    case 0x70:
      progname._0_4_ = (uint)progname | 1;
      break;
    case 0x76:
      versions.versions_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    }
  }
  iVar3 = argc - _optind;
  lVar5 = (long)_optind;
  VersionsList::VersionsList((VersionsList *)local_50,(uint)progname);
  if (argc == iVar2) {
    VersionsList::Read((VersionsList *)local_50,(istream *)&std::cin);
  }
  for (local_60 = 0; local_60 < iVar3; local_60 = local_60 + 1) {
    pcVar1 = argv[lVar5 + local_60];
    _Var4 = std::operator|(_S_in,_S_out);
    std::fstream::fstream(local_270,pcVar1,_Var4);
    VersionsList::Read((VersionsList *)local_50,local_270);
    std::fstream::~fstream(local_270);
  }
  VersionsList::Sort((VersionsList *)local_50);
  if ((versions.versions_.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    VersionsList::Dump((VersionsList *)local_50,(ostream *)&std::cout);
  }
  else {
    VersionsList::VerboseDump((VersionsList *)local_50,(ostream *)&std::cout);
  }
  VersionsList::~VersionsList((VersionsList *)local_50);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	int ch, flags = 0;
	const char* progname = argv[0];
	bool verbose = false;

	while ((ch = getopt(argc, argv, "pahvV")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'V':
			print_version();
			return 0;
		case 'v':
			verbose = true;
			break;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	VersionsList versions(flags);

	if (argc == 0) {
		versions.Read(std::cin);
	}
	for (int arg = 0; arg < argc; ++arg) {
		std::fstream fs(argv[arg]);
		versions.Read(fs);
	}

	versions.Sort();

	if (verbose) {
		versions.VerboseDump(std::cout);
	} else {
		versions.Dump(std::cout);
	}

	return 0;
}